

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<pbrt::CameraHandle_const&,int_const&,int_const&,int_const&,int_const&,float_const&,float_const&,pbrt::LightSamplerHandle_const&,bool_const&>
               (string *s,char *fmt,CameraHandle *v,int *args,int *args_1,int *args_2,int *args_3,
               float *args_4,float *args_5,LightSamplerHandle *args_6,bool *args_7)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  int *unaff_RBX;
  string *in_RDI;
  int *unaff_R14;
  int *unaff_retaddr;
  char *in_stack_00000008;
  string *in_stack_00000010;
  float *in_stack_00000030;
  float *in_stack_00000038;
  LightSamplerHandle *in_stack_00000040;
  bool *in_stack_00000048;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  CameraHandle *in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  string *in_stack_fffffffffffffd90;
  char **in_stack_fffffffffffffd98;
  char **in_stack_fffffffffffffda0;
  CameraHandle *in_stack_fffffffffffffda8;
  ostream *in_stack_fffffffffffffdb0;
  string local_248 [32];
  undefined8 local_228;
  string local_220 [32];
  stringstream local_200 [8];
  char *in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe14;
  char *in_stack_fffffffffffffe18;
  LogLevel in_stack_fffffffffffffe24;
  string local_60 [72];
  
  copyToFormatString(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  lVar1 = std::__cxx11::string::find((char)local_60,0x2a);
  lVar2 = std::__cxx11::string::find((char)local_60,0x73);
  lVar3 = std::__cxx11::string::find((char)local_60,100);
  if (lVar1 != -1) {
    LogFatal(in_stack_fffffffffffffe24,in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
             in_stack_fffffffffffffe08);
  }
  if (lVar3 != -1) {
    LogFatal(in_stack_fffffffffffffe24,in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
             in_stack_fffffffffffffe08);
  }
  if (lVar2 == -1) {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      LogFatal(in_stack_fffffffffffffe24,in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
               in_stack_fffffffffffffe08);
    }
    std::__cxx11::string::c_str();
    formatOne<pbrt::CameraHandle_const&>(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffd98);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd98);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_200);
    pbrt::operator<<(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    std::__cxx11::string::c_str();
    std::__cxx11::stringstream::str();
    local_228 = std::__cxx11::string::c_str();
    formatOne<char_const*>((char *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
    std::__cxx11::string::operator+=(in_RDI,local_220);
    std::__cxx11::string::~string(local_220);
    std::__cxx11::string::~string(local_248);
    std::__cxx11::stringstream::~stringstream(local_200);
  }
  stringPrintfRecursive<int_const&,int_const&,int_const&,int_const&,float_const&,float_const&,pbrt::LightSamplerHandle_const&,bool_const&>
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,unaff_R14,unaff_RBX,(int *)in_RDI,
             in_stack_00000030,in_stack_00000038,in_stack_00000040,in_stack_00000048);
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}